

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrEva.c
# Opt level: O2

void Rwr_ScoresReport(Rwr_Man_t *p)

{
  uint i;
  Vec_Ptr_t *pVVar1;
  void *pvVar2;
  int iVar3;
  Vec_Vec_t *p_00;
  long lVar4;
  ulong uVar5;
  uint uTruth;
  long local_3b0;
  int Perm [222];
  
  p_00 = p->vClasses;
  if (p_00->nSize != 0xde) {
    __assert_fail("p->vClasses->nSize == 222",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/rwr/rwrEva.c"
                  ,0x22f,"void Rwr_ScoresReport(Rwr_Man_t *)");
  }
  iVar3 = 0xde;
  for (lVar4 = 0; lVar4 < iVar3; lVar4 = lVar4 + 1) {
    Perm[lVar4] = (int)lVar4;
    Gains[lVar4] = 0;
    pVVar1 = Vec_VecEntry(p_00,(int)lVar4);
    for (iVar3 = 0; iVar3 < pVVar1->nSize; iVar3 = iVar3 + 1) {
      pvVar2 = Vec_PtrEntry(pVVar1,iVar3);
      Gains[lVar4] = Gains[lVar4] + (int)*(short *)((long)pvVar2 + 10);
    }
    p_00 = p->vClasses;
    iVar3 = p_00->nSize;
  }
  qsort(Perm,0xde,4,Rwr_ScoresCompare);
  local_3b0 = 0;
  while( true ) {
    if (p->vClasses->nSize <= local_3b0) {
      return;
    }
    i = Perm[local_3b0];
    if (Gains[(int)i] == 0) break;
    pVVar1 = Vec_VecEntry(p->vClasses,i);
    printf("CLASS %3d: Subgr = %3d. Total gain = %6d.  ",(ulong)i,(ulong)(uint)pVVar1->nSize,
           (ulong)(uint)Gains[(int)i]);
    uTruth = (uint)p->pMapInv[(int)i];
    Extra_PrintBinary(_stdout,&uTruth,0x10);
    printf("  ");
    Ivy_TruthDsdComputePrint(CONCAT22(p->pMapInv[(int)i],p->pMapInv[(int)i]));
    uVar5 = 0;
    while (iVar3 = (int)uVar5, iVar3 < pVVar1->nSize) {
      pvVar2 = Vec_PtrEntry(pVVar1,iVar3);
      if ((int)*(short *)((long)pvVar2 + 8) != 0) {
        printf("    %2d: S=%5d. A=%5d. G=%6d. ",uVar5,(ulong)(uint)(int)*(short *)((long)pvVar2 + 8)
               ,(ulong)(uint)(int)*(short *)((long)pvVar2 + 0xc),
               (ulong)(uint)(int)*(short *)((long)pvVar2 + 10));
        Dec_GraphPrint(_stdout,*(Dec_Graph_t **)((long)pvVar2 + 0x28),(char **)0x0,(char *)0x0);
      }
      uVar5 = (ulong)(iVar3 + 1);
    }
    local_3b0 = local_3b0 + 1;
  }
  return;
}

Assistant:

void Rwr_ScoresReport( Rwr_Man_t * p )
{
    extern void Ivy_TruthDsdComputePrint( unsigned uTruth );
    int Perm[222];
    Vec_Ptr_t * vSubgraphs;
    Rwr_Node_t * pNode;
    int i, iNew, k;
    unsigned uTruth;
    // collect total gains
    assert( p->vClasses->nSize == 222 );
    for ( i = 0; i < p->vClasses->nSize; i++ )
    {
        Perm[i] = i;
        Gains[i] = 0;
        vSubgraphs = Vec_VecEntry( p->vClasses, i );
        Vec_PtrForEachEntry( Rwr_Node_t *, vSubgraphs, pNode, k )
            Gains[i] += pNode->nGain;
    }
    // sort the gains
    qsort( Perm, 222, sizeof(int), (int (*)(const void *, const void *))Rwr_ScoresCompare );

    // print classes
    for ( i = 0; i < p->vClasses->nSize; i++ )
    {
        iNew = Perm[i];
        if ( Gains[iNew] == 0 )
            break;
        vSubgraphs = Vec_VecEntry( p->vClasses, iNew );
        printf( "CLASS %3d: Subgr = %3d. Total gain = %6d.  ", iNew, Vec_PtrSize(vSubgraphs), Gains[iNew] );
        uTruth = (unsigned)p->pMapInv[iNew];
        Extra_PrintBinary( stdout, &uTruth, 16 );
        printf( "  " );
        Ivy_TruthDsdComputePrint( (unsigned)p->pMapInv[iNew] | ((unsigned)p->pMapInv[iNew] << 16) );
        Vec_PtrForEachEntry( Rwr_Node_t *, vSubgraphs, pNode, k )
        {
            if ( pNode->nScore == 0 )
                continue;
            printf( "    %2d: S=%5d. A=%5d. G=%6d. ", k, pNode->nScore, pNode->nAdded, pNode->nGain );
            Dec_GraphPrint( stdout, (Dec_Graph_t *)pNode->pNext, NULL, NULL );
        }
    }
}